

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

var * __thiscall cs::domain_type::get_var_no_check(domain_type *this,var_id *id,size_t domain_id)

{
  bool bVar1;
  shared_ptr<cs::domain_ref> *psVar2;
  reference pvVar3;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  shared_ptr<cs::domain_ref> *in_RDI;
  raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *unaff_retaddr;
  shared_ptr<cs::domain_ref> *in_stack_ffffffffffffffd8;
  
  *in_RSI = in_RDX;
  psVar2 = in_RDI;
  bVar1 = std::operator!=(in_RDI,in_stack_ffffffffffffffd8);
  if (bVar1) {
    psVar2 = (shared_ptr<cs::domain_ref> *)
             phmap::priv::
             raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
             ::
             at<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>>
                       (unaff_retaddr,(key_arg<std::__cxx11::basic_string<char>_> *)psVar2);
    in_RSI[1] = (psVar2->super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::shared_ptr<cs::domain_ref>::operator=(in_RDI,psVar2);
  }
  pvVar3 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[]
                     ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)(in_RDI + 4),in_RSI[1])
  ;
  return pvVar3;
}

Assistant:

var &get_var_no_check(const var_id &id, std::size_t domain_id) noexcept
		{
			id.m_domain_id = domain_id;
			if (id.m_ref != m_ref) {
				id.m_slot_id = m_reflect.at(id.m_id);
				id.m_ref = m_ref;
			}
			return m_slot[id.m_slot_id];
		}